

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_active_uniformsiv(NegativeTestContext *ctx)

{
  pointer *this;
  RenderContext *renderCtx;
  GLuint GVar1;
  GLenum error;
  int iVar2;
  GLint numActiveUniforms;
  GLint dummyParamDst;
  allocator_type local_30d;
  GLuint local_30c;
  vector<int,_std::allocator<int>_> dummyParamsDst;
  GLuint dummyUniformIndex;
  string local_2c8;
  string local_2a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidUniformIndices;
  ShaderProgram program;
  
  GVar1 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,(allocator<char> *)&dummyParamDst);
  getVtxFragVersionSources((string *)&dummyParamsDst,&local_2a8,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,(allocator<char> *)&numActiveUniforms);
  getVtxFragVersionSources((string *)&dummyUniformIndex,&local_2c8,ctx);
  glu::makeVtxFragSources
            ((ProgramSources *)&invalidUniformIndices,(string *)&dummyParamsDst,
             (string *)&dummyUniformIndex);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&invalidUniformIndices);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&invalidUniformIndices);
  std::__cxx11::string::~string((string *)&dummyUniformIndex);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&dummyParamsDst);
  std::__cxx11::string::~string((string *)&local_2a8);
  dummyUniformIndex = 1;
  dummyParamDst = -1;
  numActiveUniforms = -1;
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8b86,&numActiveUniforms);
  invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(ctx->super_CallLogWrapper).m_log;
  this = &invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"// GL_ACTIVE_UNIFORMS = ");
  std::ostream::operator<<(this,numActiveUniforms);
  std::operator<<((ostream *)this," (expected 4).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&invalidUniformIndices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidUniformIndices,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             (allocator<char> *)&dummyParamsDst);
  NegativeTestContext::beginSection(ctx,(string *)&invalidUniformIndices);
  std::__cxx11::string::~string((string *)&invalidUniformIndices);
  iVar2 = -1;
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,0xffffffff,1,&dummyUniformIndex,0x8a37,&dummyParamDst);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidUniformIndices,
             "GL_INVALID_OPERATION is generated if program is not a program object.",
             (allocator<char> *)&dummyParamsDst);
  NegativeTestContext::beginSection(ctx,(string *)&invalidUniformIndices);
  std::__cxx11::string::~string((string *)&invalidUniformIndices);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,GVar1,1,&dummyUniformIndex,0x8a37,&dummyParamDst);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidUniformIndices,
             "GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program."
             ,(allocator<char> *)&dummyParamsDst);
  local_30c = GVar1;
  NegativeTestContext::beginSection(ctx,(string *)&invalidUniformIndices);
  std::__cxx11::string::~string((string *)&invalidUniformIndices);
  while (iVar2 != 2) {
    invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&invalidUniformIndices,
               (uint *)&dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>);
    dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = numActiveUniforms + iVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&invalidUniformIndices,
               (uint *)&dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>);
    dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&invalidUniformIndices,
               (uint *)&dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>,
               (long)invalidUniformIndices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)invalidUniformIndices.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_30d);
    glu::CallLogWrapper::glGetActiveUniformsiv
              (&ctx->super_CallLogWrapper,program.m_program.m_program,
               (GLsizei)((ulong)((long)invalidUniformIndices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)invalidUniformIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
               invalidUniformIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start,0x8a37,
               (GLint *)CONCAT44(dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start));
    iVar2 = iVar2 + 1;
    error = 0x501;
    if (iVar2 == 0) {
      error = 0;
    }
    NegativeTestContext::expectError(ctx,error);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dummyParamsDst.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&invalidUniformIndices);
  }
  NegativeTestContext::endSection(ctx);
  GVar1 = local_30c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidUniformIndices,
             "GL_INVALID_ENUM is generated if pname is not an accepted token.",
             (allocator<char> *)&dummyParamsDst);
  NegativeTestContext::beginSection(ctx,(string *)&invalidUniformIndices);
  std::__cxx11::string::~string((string *)&invalidUniformIndices);
  glu::CallLogWrapper::glGetActiveUniformsiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,1,&dummyUniformIndex,0xffffffff,
             &dummyParamDst);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,GVar1);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_active_uniformsiv (NegativeTestContext& ctx)
{
	GLuint					shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram		program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLuint					dummyUniformIndex	= 1;
	GLint					dummyParamDst		= -1;
	GLint					numActiveUniforms	= -1;

	ctx.glUseProgram(program.getProgram());

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_UNIFORMS, &numActiveUniforms);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_UNIFORMS = " << numActiveUniforms << " (expected 4)." << TestLog::EndMessage;

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveUniformsiv(-1, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveUniformsiv(shader, 1, &dummyUniformIndex, GL_UNIFORM_TYPE, &dummyParamDst);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if any value in uniformIndices is greater than or equal to the value of GL_ACTIVE_UNIFORMS for program.");
	for (int excess = 0; excess <= 2; excess++)
	{
		std::vector<GLuint> invalidUniformIndices;
		invalidUniformIndices.push_back(1);
		invalidUniformIndices.push_back(numActiveUniforms-1+excess);
		invalidUniformIndices.push_back(1);

		std::vector<GLint> dummyParamsDst(invalidUniformIndices.size());
		ctx.glGetActiveUniformsiv(program.getProgram(), (GLsizei)invalidUniformIndices.size(), &invalidUniformIndices[0], GL_UNIFORM_TYPE, &dummyParamsDst[0]);
		ctx.expectError(excess == 0 ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not an accepted token.");
	ctx.glGetActiveUniformsiv(program.getProgram(), 1, &dummyUniformIndex, -1, &dummyParamDst);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}